

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureCubeArray_GL.cpp
# Opt level: O2

void __thiscall
Diligent::TextureCubeArray_GL::AttachToFramebuffer
          (TextureCubeArray_GL *this,TextureViewDesc *ViewDesc,GLenum AttachmentPoint,
          FRAMEBUFFER_TARGET_FLAGS Targets)

{
  undefined4 in_register_0000000c;
  GLenum err;
  string msg;
  uint local_54;
  string local_50;
  
  if ((ViewDesc->field_6).NumArraySlices == 1) {
    if ((Targets & FRAMEBUFFER_TARGET_FLAG_DRAW) != FRAMEBUFFER_TARGET_FLAG_NONE) {
      if ((ViewDesc->ViewType & ~TEXTURE_VIEW_SHADER_RESOURCE) != TEXTURE_VIEW_RENDER_TARGET) {
        FormatString<char[26],char[99]>
                  (&local_50,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET || ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL"
                   ,(char (*) [99])CONCAT44(in_register_0000000c,Targets));
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCubeArray_GL.cpp"
                   ,0x111);
        std::__cxx11::string::~string((string *)&local_50);
      }
      (*__glewFramebufferTextureLayer)
                (0x8ca9,AttachmentPoint,(this->super_TextureBaseGL).m_GlTexture.m_uiHandle,
                 ViewDesc->MostDetailedMip,(ViewDesc->field_5).FirstArraySlice);
      local_54 = glGetError();
      if (local_54 != 0) {
        LogError<false,char[59],char[17],unsigned_int>
                  (false,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCubeArray_GL.cpp"
                   ,0x113,(char (*) [59])
                          "Failed to attach texture cubemap array to draw framebuffer",
                   (char (*) [17])"\nGL Error Code: ",&local_54);
        FormatString<char[6]>(&local_50,(char (*) [6])0x731c01);
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCubeArray_GL.cpp"
                   ,0x113);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    if ((Targets & FRAMEBUFFER_TARGET_FLAG_READ) == FRAMEBUFFER_TARGET_FLAG_NONE) {
      return;
    }
    (*__glewFramebufferTextureLayer)
              (0x8ca8,AttachmentPoint,(this->super_TextureBaseGL).m_GlTexture.m_uiHandle,
               ViewDesc->MostDetailedMip,(ViewDesc->field_5).FirstArraySlice);
    local_54 = glGetError();
    if (local_54 == 0) {
      return;
    }
    LogError<false,char[59],char[17],unsigned_int>
              (false,"AttachToFramebuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCubeArray_GL.cpp"
               ,0x118,(char (*) [59])"Failed to attach texture cubemap array to read framebuffer",
               (char (*) [17])"\nGL Error Code: ",&local_54);
    FormatString<char[6]>(&local_50,(char (*) [6])0x731c01);
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"AttachToFramebuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCubeArray_GL.cpp"
               ,0x118);
  }
  else if ((ViewDesc->field_6).NumArraySlices ==
           (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
           super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
           .m_Desc.field_3.ArraySize) {
    if ((Targets & FRAMEBUFFER_TARGET_FLAG_DRAW) != FRAMEBUFFER_TARGET_FLAG_NONE) {
      if ((ViewDesc->ViewType & ~TEXTURE_VIEW_SHADER_RESOURCE) != TEXTURE_VIEW_RENDER_TARGET) {
        FormatString<char[26],char[99]>
                  (&local_50,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET || ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL"
                   ,(char (*) [99])CONCAT44(in_register_0000000c,Targets));
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCubeArray_GL.cpp"
                   ,0x120);
        std::__cxx11::string::~string((string *)&local_50);
      }
      (*__glewFramebufferTexture)
                (0x8ca9,AttachmentPoint,(this->super_TextureBaseGL).m_GlTexture.m_uiHandle,
                 ViewDesc->MostDetailedMip);
      local_54 = glGetError();
      if (local_54 != 0) {
        LogError<false,char[59],char[17],unsigned_int>
                  (false,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCubeArray_GL.cpp"
                   ,0x122,(char (*) [59])
                          "Failed to attach texture cubemap array to draw framebuffer",
                   (char (*) [17])"\nGL Error Code: ",&local_54);
        FormatString<char[6]>(&local_50,(char (*) [6])0x731c01);
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCubeArray_GL.cpp"
                   ,0x122);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    if ((Targets & FRAMEBUFFER_TARGET_FLAG_READ) == FRAMEBUFFER_TARGET_FLAG_NONE) {
      return;
    }
    (*__glewFramebufferTexture)
              (0x8ca8,AttachmentPoint,(this->super_TextureBaseGL).m_GlTexture.m_uiHandle,
               ViewDesc->MostDetailedMip);
    local_54 = glGetError();
    if (local_54 == 0) {
      return;
    }
    LogError<false,char[59],char[17],unsigned_int>
              (false,"AttachToFramebuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCubeArray_GL.cpp"
               ,0x127,(char (*) [59])"Failed to attach texture cubemap array to read framebuffer",
               (char (*) [17])"\nGL Error Code: ",&local_54);
    FormatString<char[6]>(&local_50,(char (*) [6])0x731c01);
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"AttachToFramebuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCubeArray_GL.cpp"
               ,0x127);
  }
  else {
    FormatString<char[76]>
              (&local_50,
               (char (*) [76])
               "Only one slice or the entire cubemap array can be attached to a framebuffer");
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"AttachToFramebuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCubeArray_GL.cpp"
               ,300);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void TextureCubeArray_GL::AttachToFramebuffer(const TextureViewDesc& ViewDesc, GLenum AttachmentPoint, FRAMEBUFFER_TARGET_FLAGS Targets)
{
    // Same as for 2D array textures

    // Every OpenGL API call that operates on cubemap array textures takes layer-faces, not array layers.
    // So the parameters that represent the Z component are layer-faces.
    if (ViewDesc.NumArraySlices == 1)
    {
        // Texture name must either be zero or the name of an existing 3D texture, 1D or 2D array texture,
        // cube map array texture, or multisample array texture.
        if (Targets & FRAMEBUFFER_TARGET_FLAG_DRAW)
        {
            VERIFY_EXPR(ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET || ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL);
            glFramebufferTextureLayer(GL_DRAW_FRAMEBUFFER, AttachmentPoint, m_GlTexture, ViewDesc.MostDetailedMip, ViewDesc.FirstArraySlice);
            DEV_CHECK_GL_ERROR("Failed to attach texture cubemap array to draw framebuffer");
        }
        if (Targets & FRAMEBUFFER_TARGET_FLAG_READ)
        {
            glFramebufferTextureLayer(GL_READ_FRAMEBUFFER, AttachmentPoint, m_GlTexture, ViewDesc.MostDetailedMip, ViewDesc.FirstArraySlice);
            DEV_CHECK_GL_ERROR("Failed to attach texture cubemap array to read framebuffer");
        }
    }
    else if (ViewDesc.NumArraySlices == m_Desc.ArraySize)
    {
        // glFramebufferTexture() attaches the given mipmap level as a layered image with the number of layers that the given texture has.
        if (Targets & FRAMEBUFFER_TARGET_FLAG_DRAW)
        {
            VERIFY_EXPR(ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET || ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL);
            glFramebufferTexture(GL_DRAW_FRAMEBUFFER, AttachmentPoint, m_GlTexture, ViewDesc.MostDetailedMip);
            DEV_CHECK_GL_ERROR("Failed to attach texture cubemap array to draw framebuffer");
        }
        if (Targets & FRAMEBUFFER_TARGET_FLAG_READ)
        {
            glFramebufferTexture(GL_READ_FRAMEBUFFER, AttachmentPoint, m_GlTexture, ViewDesc.MostDetailedMip);
            DEV_CHECK_GL_ERROR("Failed to attach texture cubemap array to read framebuffer");
        }
    }
    else
    {
        UNEXPECTED("Only one slice or the entire cubemap array can be attached to a framebuffer");
    }
}